

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md5.hpp
# Opt level: O2

uint32_t rest_rpc::MD5::MD5CE::CalcF(uint32_t i,IntermediateData *intermediate)

{
  uint32_t uVar1;
  
  uVar1 = CalcF(i,intermediate->b,intermediate->c,intermediate->d);
  return uVar1;
}

Assistant:

static uint32_t CalcF(const uint32_t i,
                        const IntermediateData &intermediate) {
    return CalcF(i, intermediate.b, intermediate.c, intermediate.d);
  }